

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void ravi_create_number_array(lua_State *L,int narray,lua_Number initial_value)

{
  StkId pTVar1;
  int iVar2;
  RaviArray *pRVar3;
  RaviArray *x_;
  TValue *io;
  RaviArray *t;
  lua_Number initial_value_local;
  int narray_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x340,"void ravi_create_number_array(lua_State *, int, lua_Number)");
  }
  pRVar3 = raviH_new_number_array(L,narray,initial_value);
  pTVar1 = L->top;
  if (9 < (pRVar3->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x342,"void ravi_create_number_array(lua_State *, int, lua_Number)");
  }
  (pTVar1->value_).gc = (GCObject *)pRVar3;
  pTVar1->tt_ = 0x8025;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x342,"void ravi_create_number_array(lua_State *, int, lua_Number)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00118f00:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x342,"void ravi_create_number_array(lua_State *, int, lua_Number)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x342,"void ravi_create_number_array(lua_State *, int, lua_Number)");
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00118f00;
    }
  }
  L->top = L->top + 1;
  if (L->ci->top < L->top) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x343,"void ravi_create_number_array(lua_State *, int, lua_Number)");
  }
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x345,"void ravi_create_number_array(lua_State *, int, lua_Number)");
  }
  return;
}

Assistant:

LUA_API void ravi_create_number_array(lua_State *L, int narray,
                                    lua_Number initial_value) {
  RaviArray *t;
  lua_lock(L);
  t = raviH_new_number_array(L, (unsigned int)narray, initial_value);
  setfarrayvalue(L, L->top, t);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
}